

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unarc.c
# Opt level: O0

int do_unarc(void)

{
  Byte BVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  Ftype FVar5;
  Ferror FVar6;
  uint uVar7;
  char *pcVar8;
  Byte byte;
  char *newname;
  char c;
  Byte first;
  uint uStack_450;
  Byte comptype;
  Status status;
  int nfiles;
  Word nbytes;
  Word arcsize;
  int retrying;
  int ret;
  int level;
  char fullname [1024];
  char *pathname;
  Header *header;
  FILE *lfp;
  FILE *ofp;
  FILE *ifp;
  
  lfp = (FILE *)0x0;
  header = (Header *)0x0;
  fullname[0x3f8] = '\0';
  fullname[0x3f9] = '\0';
  fullname[0x3fa] = '\0';
  fullname[0x3fb] = '\0';
  fullname[0x3fc] = '\0';
  fullname[0x3fd] = '\0';
  fullname[0x3fe] = '\0';
  fullname[0x3ff] = '\0';
  retrying = 0;
  arcsize = 0;
  nbytes = 0;
  status = NOERR;
  uStack_450 = 0;
  ofp = (FILE *)fopen(archive,"r");
  if ((FILE *)ofp == (FILE *)0x0) {
    pcVar8 = name_dot_arc(archive);
    ofp = (FILE *)fopen(pcVar8,"r");
    if ((FILE *)ofp == (FILE *)0x0) {
      if (quiet == '\0') {
        error("cannot open archive \"%s\"",archive);
      }
      return 1;
    }
    archive = name_dot_arc(archive);
  }
  nfiles = filesize(archive);
  if ((nfiles == 0) && (quiet == '\0')) {
    error("cannot get size of archive file");
    fclose((FILE *)ofp);
    return 1;
  }
  if ((inffiles == '\0') &&
     ((((testing == '\0' && (listing == '\0')) && (logfile != (char *)0x0)) &&
      (header = (Header *)fopen(logfile,"w"), (FILE *)header == (FILE *)0x0)))) {
    warning("unable to open logfile \"%s\"",logfile);
  }
  if ((quiet == '\0') && (verbose != '\0')) {
    msg("filename                          size load/date   exec/time type storage");
    msg("--------                          ---- ----------- --------- ---- -------");
  }
LAB_00102c37:
  pathname = (char *)0x0;
  if ((arcfs == 0) && (BVar1 = read_byte(ofp), BVar1 != '\x1a')) {
    if (BVar1 != 'A') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != 'r') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != 'c') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != 'h') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != 'i') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != 'v') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != 'e') goto LAB_00103674;
    BVar1 = read_byte(ofp);
    if (BVar1 != '\0') goto LAB_00103674;
    debug("ArcFS format archive\n");
    arcfs = 1;
  }
LAB_00102d1b:
  pathname = (char *)read_header(ofp);
  bVar3 = ((Header *)pathname)->comptype & 0x7f;
  if ((bVar3 == 0) || ((bVar3 == 2 && ((((Header *)pathname)->load & 0xffffff00) == 0xfffddc00))))
  goto LAB_00102daf;
  if (((Header *)pathname)->complen <= (uint)nfiles) {
    nfiles = nfiles - ((Header *)pathname)->complen;
    goto LAB_00102daf;
  }
  debug("compressed len > archive file len");
  pathname = (char *)0x0;
  goto LAB_00103674;
LAB_00102daf:
  if (bVar3 == 0) {
    if (retrying == 0) goto LAB_00103674;
    retrying = retrying + -1;
    if ((((testing == '\0') && (listing == '\0')) && (to_stdout == '\0')) &&
       (((stamp != '\0' && (iVar4 = inlist((char *)fullname._1016_8_), iVar4 != 0)) &&
        ((iVar4 = filestamp(&do_unarc::dirheader,(char *)fullname._1016_8_), iVar4 < 0 &&
         (quiet == '\0')))))) {
      error("error stamping %s",fullname._1016_8_);
    }
    fullname._1016_8_ = uplevel();
    goto LAB_00102c37;
  }
  if ((bVar3 == 2) && ((((Header *)pathname)->load & 0xffffff00) == 0xfffddc00)) {
    retrying = retrying + 1;
    fullname._1016_8_ = downlevel(((Header *)pathname)->name);
    memcpy(&do_unarc::dirheader,pathname,0x2c);
    if ((testing == '\0') &&
       (((listing == '\0' && (to_stdout == '\0')) &&
        (iVar4 = inlist((char *)fullname._1016_8_), iVar4 != 0)))) {
      FVar5 = exist((char *)fullname._1016_8_);
      if (FVar5 == NOEXIST) {
        iVar4 = makedir((char *)fullname._1016_8_);
        if ((iVar4 < 0) && (quiet == '\0')) {
          msg("error making %s... aborting",fullname._1016_8_);
          arcsize = 4;
        }
      }
      else if (FVar5 == ISFILE) {
        if (quiet == '\0') {
          msg("%s exists as a file... aborting",fullname._1016_8_);
        }
        arcsize = 4;
        goto LAB_001037fc;
      }
    }
    goto LAB_00102c37;
  }
  if (fullname._1016_8_ == 0) {
    strcpy((char *)&ret,((Header *)pathname)->name);
  }
  else {
    sprintf((char *)&ret,"%s%c%s",fullname._1016_8_,0x2f,((Header *)pathname)->name);
  }
  iVar4 = inlist((char *)&ret);
  if (iVar4 == 0) {
    fseek((FILE *)ofp,(ulong)((Header *)pathname)->complen,1);
    goto LAB_00102c37;
  }
  if ((quiet == '\0') && (msg("%-30s",&ret), verbose != '\0')) {
    print_details((Header *)pathname);
  }
  status = ((Header *)pathname)->origlen + status;
  uStack_450 = uStack_450 + 1;
  if (listing != '\0') {
    if (quiet == '\0') {
      putc(10,_stderr);
    }
    fseek((FILE *)ofp,(ulong)((Header *)pathname)->complen,1);
    goto LAB_00102c37;
  }
  if (quiet == '\0') {
    putc(0x20,_stderr);
  }
  if ((apptype != '\0') && (to_stdout == '\0')) {
    append_type((Header *)pathname,(char *)&ret);
  }
  if ((testing == '\0') && (to_stdout == '\0')) {
    while (FVar5 = exist((char *)&ret), FVar5 != NOEXIST) {
      if (FVar5 != ISFILE) {
        if (FVar5 == ISDIR) {
          if (quiet == '\0') {
            msg("exists as a directory... skipping");
          }
          goto LAB_00102c37;
        }
        break;
      }
      if (force != '\0') break;
      cVar2 = prompt_user((char *)&ret);
      if (cVar2 == 'a') {
        force = '\x01';
        break;
      }
      if (cVar2 == 'n') {
        fseek((FILE *)ofp,(ulong)((Header *)pathname)->complen,1);
        goto LAB_00102c37;
      }
      if (cVar2 != 'r') break;
      pcVar8 = get_newname();
      if (fullname._1016_8_ == 0) {
        strcpy((char *)&ret,pcVar8);
      }
      else {
        sprintf((char *)&ret,"%s%c%s",fullname._1016_8_,0x2f,pcVar8);
      }
    }
    lfp = (FILE *)fopen((char *)&ret,"w");
    if ((FILE *)lfp == (FILE *)0x0) {
      if (quiet == '\0') {
        msg("unable to create");
      }
      goto LAB_00102c37;
    }
  }
  else if (testing == '\0') {
    lfp = _stdout;
  }
  writesize = (long)((Header *)pathname)->origlen;
  uVar7 = (uint)bVar3;
  crcsize = writesize;
  if (uVar7 - 1 < 2) {
    newname._4_4_ = unstore((Header *)pathname,ofp,lfp);
LAB_001033ea:
    if (((testing == '\0') && (to_stdout == '\0')) && (lfp != (FILE *)0x0)) {
      fclose((FILE *)lfp);
      lfp = (FILE *)0x0;
    }
    if (newname._4_4_ != RERR) {
      if (newname._4_4_ == NOERR) {
        if (((testing == '\0') && (to_stdout == '\0')) &&
           ((stamp != '\0' &&
            ((iVar4 = filestamp((Header *)pathname,(char *)&ret), iVar4 < 0 && (quiet == '\0'))))))
        {
          msg("\nerror stamping %s",&ret);
        }
        if (testing == '\0') {
          if (inffiles == '\0') {
            if (header != (Header *)0x0) {
              pcVar8 = riscos_path((char *)&ret);
              fprintf((FILE *)header,"SYS \"OS_File\", 1, \"%s\", &%08lX, &%08lX,, &%X\n",pcVar8,
                      (ulong)((Header *)pathname)->load,(ulong)((Header *)pathname)->exec,
                      (ulong)((Header *)pathname)->attr);
            }
          }
          else {
            strcpy(logfile,(char *)&ret);
            strcat(logfile,".inf");
            header = (Header *)fopen(logfile,"w");
            if ((FILE *)header != (FILE *)0x0) {
              pcVar8 = riscos_path((char *)&ret);
              fprintf((FILE *)header,"%s %08lX %08lX\n",pcVar8,(ulong)((Header *)pathname)->load,
                      (ulong)((Header *)pathname)->exec);
              fclose((FILE *)header);
            }
          }
        }
      }
      else if (newname._4_4_ == WERR) {
        if (quiet == '\0') {
          msg("error writing file");
        }
      }
      else if (newname._4_4_ == CRCERR) {
        if (quiet == '\0') {
          msg("failed CRC check");
        }
        debug("  calculated CRC=0X%X",(ulong)crc);
      }
      if (quiet == '\0') {
        putc(10,_stderr);
      }
      if (arcsize != 0) goto LAB_00103674;
      goto LAB_00102c37;
    }
    if (quiet == '\0') {
      error("error reading archive");
    }
    arcsize = 3;
LAB_00103674:
    if (pathname != (char *)0x0) {
LAB_001037fc:
      if (verbose != '\0') {
        msg("total of %ld bytes in %d files\n",(ulong)status,(ulong)uStack_450);
      }
      if ((lfp != (FILE *)0x0) && (to_stdout == '\0')) {
        fclose((FILE *)lfp);
      }
      if (header != (Header *)0x0) {
        fclose((FILE *)header);
      }
      if (ofp != (FILE *)0x0) {
        fclose((FILE *)ofp);
      }
      return arcsize;
    }
    FVar6 = check_stream(ofp);
    if (FVar6 != FNOERR) {
      if ((FVar6 != FEND) && (FVar6 == FRWERR)) {
        if (quiet == '\0') {
          msg("error reading archive");
        }
        arcsize = 3;
      }
      goto LAB_001037fc;
    }
    if (quiet == '\0') {
      msg("bad archive header");
    }
    if ((retry == '\0') || (listing != '\0')) {
      if (quiet == '\0') {
        putc(10,_stderr);
      }
LAB_001037c2:
      arcsize = 2;
      goto LAB_001037fc;
    }
    msg("... retrying");
  }
  else {
    if (uVar7 == 3) {
      newname._4_4_ = unpack((Header *)pathname,ofp,lfp);
      goto LAB_001033ea;
    }
    if (uVar7 == 8) {
      newname._4_4_ = uncompress((Header *)pathname,ofp,lfp,CRUNCH);
      goto LAB_001033ea;
    }
    if (uVar7 == 9) {
      newname._4_4_ = uncompress((Header *)pathname,ofp,lfp,SQUASH);
      goto LAB_001033ea;
    }
    if (uVar7 == 0x7f) {
      newname._4_4_ = uncompress((Header *)pathname,ofp,lfp,COMPRESS);
      goto LAB_001033ea;
    }
    error("unsupported archive type %d",(ulong)bVar3);
    if (nbytes == 0) goto LAB_001033ce;
  }
  nbytes = nbytes + 1;
  do {
    do {
      FVar6 = check_stream(ofp);
      if (FVar6 != FNOERR) goto LAB_001037c2;
      BVar1 = read_byte(ofp);
    } while (BVar1 != '\x1a');
    bVar3 = read_byte(ofp);
    uVar7 = bVar3 & 0x7f;
  } while (((2 < uVar7 - 1) && (1 < uVar7 - 8)) && (uVar7 != 0x7f));
  ungetc((uint)bVar3,(FILE *)ofp);
  goto LAB_00102d1b;
LAB_001033ce:
  fseek((FILE *)ofp,(ulong)((Header *)pathname)->complen,1);
  goto LAB_00102c37;
}

Assistant:

int
do_unarc()
{
	FILE *ifp, *ofp = NULL, *lfp = NULL;
	Header *header = NULL;
	char *pathname = NULL;
	char fullname[PATHNAMELEN];
	int level = 0, ret = 0, retrying = 0;
	Word arcsize;
	Word nbytes = 0;
	int nfiles = 0;
	Status status;

	ifp = fopen(archive, R_OPENMODE);
	if (!ifp)
	{
		ifp = fopen(name_dot_arc(archive), R_OPENMODE);
		if (!ifp)
		{
			if (!quiet)
				error("cannot open archive \"%s\"", archive);
			return (1);
		}
		archive = name_dot_arc(archive);
	}

	arcsize = filesize(archive);
	if (!arcsize && !quiet)
	{
		error("cannot get size of archive file");
		fclose(ifp);
		return (1);
	}

	/* MU changed to accomodate the -I option */
	if (!inffiles)
	{
		if (!testing && !listing && logfile)
		{
			lfp = fopen(logfile, W_OPENMODE);
			if (!lfp)
				warning("unable to open logfile \"%s\"", logfile);
		}
	}

	if (!quiet && verbose)
	{
		msg("filename                          size load/date   exec/time type storage");
		msg("--------                          ---- ----------- --------- ---- -------");
	}

	/*
	 * read compressed files from archive until end of file...
	 */
	while (1)
	{
		static Header dirheader;
		Byte comptype, first;

		header = NULL;
		if ((arcfs == 0) && ((first = read_byte(ifp)) != STARTBYTE))
		{
			if ((first == 'A') &&
				(read_byte(ifp) == 'r') &&
				(read_byte(ifp) == 'c') &&
				(read_byte(ifp) == 'h') &&
				(read_byte(ifp) == 'i') &&
				(read_byte(ifp) == 'v') &&
				(read_byte(ifp) == 'e') && (read_byte(ifp) == '\0'))
			{
				debug("ArcFS format archive\n");
				arcfs = 1;
			}
			else
				break;
		}
	  retry_loop:
		header = read_header(ifp);
		comptype = header->comptype & 0x7f;
#ifdef DEBUGGING
		debug("archive file length = %ld  level = %d\n", arcsize,
			   level);
		print_header(header);
#endif							/* DEBUGGING */

		/*
		 * If this is a compress _file_ then check archive size against
		 * compress-file length...
		 */
		if (comptype && !(comptype == CT_NOTCOMP2 &&
						  /* BB changed constants in next line to long */
						  (header->load & 0xffffff00l) == 0xfffddc00l))
		{
			if (header->complen > arcsize)
			{
				debug("compressed len > archive file len");
				header = NULL;
				break;
			}
			else
				arcsize -= header->complen;
		}

		if (!comptype)
		{						/* end of archive ? */
			if (!level)
				break;
			level--;
			/*
			 * stamp directory now that all files have
			 * been written into it
			 */
			if (!testing && !listing && !to_stdout && stamp && inlist(pathname))
				if (filestamp(&dirheader, pathname) < 0 && !quiet)
					error("error stamping %s", pathname);
			pathname = uplevel();
			continue;
		}

		/*
		 * test for directory or file (file type = &DDC = archive)
		 */
		if (comptype == CT_NOTCOMP2 &&
			/* BB changed constants in next line to long */
			(header->load & 0xffffff00l) == 0xfffddc00l)
		{
			level++;
			pathname = downlevel(header->name);
			dirheader = *header;	/* make copy of header */

			/*
			 * create directory
			 */
			if (!testing && !listing && !to_stdout && inlist(pathname))
				switch (exist(pathname))
				{
				case NOEXIST:
					if (makedir(pathname) < 0 && !quiet)
					{
						msg("error making %s... aborting", pathname);
						ret = 4;
						break;
					}
					break;

				case ISFILE:
					if (!quiet)
						msg("%s exists as a file... aborting",
							   pathname);
					ret = 4;
					goto unarc_exit;
				case ISDIR:
				default:
					break;
				}
		}
		else
		{						/* file */
			if (pathname)
				sprintf(fullname, "%s%c%s", pathname, PATHSEP,
						header->name);
			else
				strcpy(fullname, header->name);

			if (!inlist(fullname))
			{
				fseek(ifp, (long) header->complen, 1);
				continue;
			}

			/*
			 * print the archive file details...
			 */
			if (!quiet)
			{
				msg("%-30s", fullname);
				if (verbose)
					print_details(header);
			}

			/* add to totals */
			nbytes += header->origlen;
			nfiles++;

			if (listing)
			{
				/* if listing, nothing more to do */
				if (!quiet)
					putc('\n', stderr);
				fseek(ifp, (long) header->complen, 1);
				continue;
			}
			else if (!quiet)
				putc(' ', stderr);

			/*
			 * append the filetype to the name
			 */
			if (apptype && !to_stdout)
				append_type(header, fullname);

			/*
			 * if actually unarchiving then check if the file already exists
			 */
			if (!testing && !to_stdout)
			{
			  test_exist:
				switch (exist(fullname))
				{
				case ISFILE:
					if (!force)
					{
						char c = prompt_user(fullname);
						if (c == 'a')
							force = 1;
						else if (c == 'n')
						{
							fseek(ifp, (long) header->complen, 1);
							continue;
						}
						else if (c == 'r')
						{
							char *newname = get_newname();
							if (pathname)
								sprintf(fullname, "%s%c%s", pathname,
										PATHSEP, newname);
							else
								strcpy(fullname, newname);
							goto test_exist;
						}
						/* if (c == 'y') FALLTHROUGH */
					}
					break;
				case ISDIR:
					if (!quiet)
						msg("exists as a directory... skipping");
					continue;
				case NOEXIST:
				default:
					break;
				}
				ofp = fopen(fullname, W_OPENMODE);
				if (!ofp)
				{
					if (!quiet)
						msg("unable to create");
					continue;
				}
			}
			else if (!testing)
			{
				ofp = stdout;
			}

			/*
			 * do the unpacking
			 */
			crcsize = writesize = header->origlen;
			switch (comptype)
			{
			case CT_NOTCOMP:
			case CT_NOTCOMP2:
				status = unstore(header, ifp, ofp);
				break;
			case CT_CRUNCH:
				status = uncompress(header, ifp, ofp, CRUNCH);
				break;
			case CT_PACK:
				status = unpack(header, ifp, ofp);
				break;
			case CT_SQUASH:
				status = uncompress(header, ifp, ofp, SQUASH);
				break;
			case CT_COMP:
				status = uncompress(header, ifp, ofp, COMPRESS);
				break;
			default:
				error("unsupported archive type %d", comptype);
				if (retrying)
					goto do_retry;
				fseek(ifp, (long) header->complen, 1);
				continue;
			}

			if (!testing && !to_stdout && ofp)
			{
				fclose(ofp);
				ofp = NULL;
			}

			/*
			 * check if unarchiving failed.
			 * (RERR check is not in switch() because `break'
			 * needs to escape from while())
			 */
			if (status == RERR)
			{
				if (!quiet)
					error("error reading archive");
				ret = 3;
				break;
			}
			switch (status)
			{
			case WERR:
				if (!quiet)
					msg("error writing file");
				break;
			case CRCERR:
				if (!quiet)
					msg("failed CRC check");

				/* BB changed format in next line to long hex */
				/* debug("  calculated CRC=0x%x", crc); */
#ifdef __MSDOS__
				debug("  calculated CRC=0X%lX", crc);
#else
				debug("  calculated CRC=0X%X", crc);
#endif							/* __MSDOS__ */
				break;
			case NOERR:
				if (!testing && !to_stdout && stamp)
				{
					if (filestamp(header, fullname) < 0 && !quiet)
						msg("\nerror stamping %s", fullname);
				}
				/* 
				 * XXX: if the filename has had it's filetype appended to
				 * it, it may be longer than 10 characters long making this
				 * file useless.  We could truncate the filename but there is
				 * no need to under UNIX... bit of a mismatch!
				 */
				if (!testing)
				{
					if (inffiles)
					{
						strcpy(logfile, fullname);
						strcat(logfile, ".inf");
						lfp = fopen(logfile, W_OPENMODE);

						if (lfp)
						{

/*
					// BASIC 
					if ((header->load => 0xFFFFFB41) && (header->load <= 0xFFFFFB46))
					{
						header->load = 0xFFFF1900;
						header->exec = 0xFFFF802B;
					}

					// *EXEC ie !BOOT 
					if (header->load == 0xFFFFFE41)
					{
						header->load = 0x00000000;
						header->exec = 0xFFFFFFFF;
					}
*/
							fprintf(lfp, "%s %08lX %08lX\n",
									riscos_path(fullname), (long)header->load,
									(long)header->exec);
							fclose(lfp);

						}

					}
					else
					{
						if (lfp)
						{
							fprintf(lfp,
									"SYS \"OS_File\", 1, \"%s\", &%08lX, &%08lX,, &%X\n",
									riscos_path(fullname), (long)header->load,
									(long)header->exec, header->attr);
						}
					}

				}
				break;
			default:
				break;
			}

			if (!quiet)
				putc('\n', stderr);
			if (ret)
				break;
		}
	}

	/*
	 * find out why header wasn't found
	 */
	if (!header)
		switch (check_stream(ifp))
		{
		case FNOERR:
			if (!quiet)
				msg("bad archive header");
			if (retry && !listing)
			{
				msg("... retrying");
			  do_retry:
				retrying++;
				while (check_stream(ifp) == FNOERR)
					if (read_byte(ifp) == STARTBYTE)
					{
						Byte byte = read_byte(ifp);
						switch (byte & 0x7f)
						{
						case (CT_NOTCOMP):
						case (CT_NOTCOMP2):
						case (CT_CRUNCH):
						case (CT_PACK):
						case (CT_SQUASH):
						case (CT_COMP):
							ungetc((int) byte, ifp);
							goto retry_loop;
							/* NOTREACHED */
						default:
							break;
						}
					}
			}
			else
			{
				retrying = 0;
				if (!quiet)
					putc('\n', stderr);
			}
			ret = 2;
			break;
		case FRWERR:
			if (!quiet)
				msg("error reading archive");
			ret = 3;
			break;
		case FEND:
		default:
			break;
		}

  unarc_exit:

	if (verbose)
		msg("total of %ld bytes in %d files\n", (long)nbytes, nfiles);

	if (ofp && !to_stdout)
		fclose(ofp);
	if (lfp)
		fclose(lfp);
	if (ifp)
		fclose(ifp);
	return (ret);
}